

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

TermList ApplicativeHelper::createAppTerm
                   (TermList s1,TermList s2,TermList arg1,TermList arg2,bool shared)

{
  uint function;
  int iVar1;
  TermList TVar2;
  
  if (createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)::args
      == '\0') {
    iVar1 = __cxa_guard_acquire(&createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)
                                 ::args);
    if (iVar1 != 0) {
      createAppTerm::args._cursor = (TermList *)0x0;
      createAppTerm::args._end = (TermList *)0x0;
      createAppTerm::args._capacity = 0;
      createAppTerm::args._stack = (TermList *)0x0;
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&createAppTerm::args,&__dso_handle);
      __cxa_guard_release(&createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)
                           ::args);
    }
  }
  createAppTerm::args._cursor = createAppTerm::args._stack;
  Lib::Stack<Kernel::TermList>::push(&createAppTerm::args,s1);
  Lib::Stack<Kernel::TermList>::push(&createAppTerm::args,s2);
  Lib::Stack<Kernel::TermList>::push(&createAppTerm::args,arg1);
  Lib::Stack<Kernel::TermList>::push(&createAppTerm::args,arg2);
  function = Kernel::Signature::getApp(DAT_00a14190);
  if (shared) {
    TVar2._content = (uint64_t)Kernel::Term::create(function,4,createAppTerm::args._stack);
  }
  else {
    TVar2._content = (uint64_t)Kernel::Term::createNonShared(function,4,createAppTerm::args._stack);
  }
  return (TermList)TVar2._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList s1, TermList s2, TermList arg1, TermList arg2, bool shared)
{
  static TermStack args;
  args.reset();
  args.push(s1);
  args.push(s2);
  args.push(arg1);
  args.push(arg2);
  unsigned app = env.signature->getApp();
  if(shared){
    return TermList(Term::create(app, 4, args.begin()));
  }
  return TermList(Term::createNonShared(app, 4, args.begin()));    
}